

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImGuiStyle::ScaleAllSizes(ImGuiStyle *this,float scale_factor)

{
  float fVar1;
  undefined4 uVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  undefined4 uVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  
  IVar3 = this->ItemSpacing;
  IVar7.x = (float)(int)((this->WindowPadding).x * scale_factor);
  IVar7.y = (float)(int)((this->WindowPadding).y * scale_factor);
  this->WindowPadding = IVar7;
  this->WindowRounding = (float)(int)(this->WindowRounding * scale_factor);
  IVar8.x = (float)(int)((this->WindowMinSize).x * scale_factor);
  IVar8.y = (float)(int)((this->WindowMinSize).y * scale_factor);
  this->WindowMinSize = IVar8;
  this->ChildRounding = (float)(int)(this->ChildRounding * scale_factor);
  this->PopupRounding = (float)(int)(this->PopupRounding * scale_factor);
  IVar6.x = (float)(int)((this->FramePadding).x * scale_factor);
  IVar6.y = (float)(int)((this->FramePadding).y * scale_factor);
  this->FramePadding = IVar6;
  this->FrameRounding = (float)(int)(this->FrameRounding * scale_factor);
  IVar4 = this->ItemInnerSpacing;
  (this->ItemSpacing).x = (float)(int)(IVar3.x * scale_factor);
  (this->ItemSpacing).y = (float)(int)(IVar3.y * scale_factor);
  (this->ItemInnerSpacing).x = (float)(int)(IVar4.x * scale_factor);
  (this->ItemInnerSpacing).y = (float)(int)(IVar4.y * scale_factor);
  IVar3.y = (float)(int)((this->CellPadding).y * scale_factor);
  IVar3.x = (float)(int)((this->CellPadding).x * scale_factor);
  this->CellPadding = IVar3;
  IVar4.y = (float)(int)((this->TouchExtraPadding).y * scale_factor);
  IVar4.x = (float)(int)((this->TouchExtraPadding).x * scale_factor);
  this->TouchExtraPadding = IVar4;
  this->IndentSpacing = (float)(int)(this->IndentSpacing * scale_factor);
  this->ColumnsMinSpacing = (float)(int)(this->ColumnsMinSpacing * scale_factor);
  this->ScrollbarSize = (float)(int)(this->ScrollbarSize * scale_factor);
  this->ScrollbarRounding = (float)(int)(this->ScrollbarRounding * scale_factor);
  uVar2 = this->GrabMinSize;
  uVar5 = this->GrabRounding;
  this->GrabMinSize = (float)(int)((float)uVar2 * scale_factor);
  this->GrabRounding = (float)(int)((float)uVar5 * scale_factor);
  this->TabRounding = (float)(int)(this->TabRounding * scale_factor);
  fVar1 = this->TabMinWidthForUnselectedCloseButton;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    this->TabMinWidthForUnselectedCloseButton = (float)(int)(fVar1 * scale_factor);
  }
  IVar3 = this->DisplayWindowPadding;
  IVar4 = this->DisplaySafeAreaPadding;
  (this->DisplayWindowPadding).x = (float)(int)(IVar3.x * scale_factor);
  (this->DisplayWindowPadding).y = (float)(int)(IVar3.y * scale_factor);
  (this->DisplaySafeAreaPadding).x = (float)(int)(IVar4.x * scale_factor);
  (this->DisplaySafeAreaPadding).y = (float)(int)(IVar4.y * scale_factor);
  this->MouseCursorScale = (float)(int)(scale_factor * this->MouseCursorScale);
  return;
}

Assistant:

static inline ImVec2 operator*(const ImVec2& lhs, const float rhs)              { return ImVec2(lhs.x * rhs, lhs.y * rhs); }